

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_isSolveStopped(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,bool *stoppedTime,bool *stoppedIter)

{
  Real *pRVar1;
  double dVar2;
  Settings *pSVar3;
  bool bVar4;
  double extraout_XMM0_Qa;
  
  dVar2 = this->_currentSettings->_realParamValues[6];
  pRVar1 = this->_currentSettings->_realParamValues + 7;
  if (dVar2 < *pRVar1 || dVar2 == *pRVar1) {
    bVar4 = false;
  }
  else {
    (*this->_statistics->solvingTime->_vptr_Timer[6])();
    bVar4 = this->_currentSettings->_realParamValues[7] <= extraout_XMM0_Qa;
  }
  *stoppedTime = bVar4;
  pSVar3 = this->_currentSettings;
  if (((pSVar3->_intParamValues[5] < 0) ||
      (bVar4 = true, this->_statistics->iterations < pSVar3->_intParamValues[5])) &&
     ((pSVar3->_intParamValues[6] < 0 ||
      (bVar4 = true, this->_statistics->refinements < pSVar3->_intParamValues[6])))) {
    if (pSVar3->_intParamValues[7] < 0) {
      bVar4 = false;
    }
    else {
      bVar4 = pSVar3->_intParamValues[7] <= this->_statistics->stallRefinements;
    }
  }
  *stoppedIter = bVar4;
  return (bool)(bVar4 | *stoppedTime & 1U);
}

Assistant:

bool SoPlexBase<R>::_isSolveStopped(bool& stoppedTime, bool& stoppedIter) const
{
   assert(_statistics != nullptr);

   stoppedTime = (realParam(TIMELIMIT) < realParam(INFTY)
                  && _statistics->solvingTime->time() >= realParam(TIMELIMIT));
   stoppedIter = (intParam(ITERLIMIT) >= 0 && _statistics->iterations >= intParam(ITERLIMIT))
                 || (intParam(REFLIMIT) >= 0 && _statistics->refinements >= intParam(REFLIMIT))
                 || (intParam(STALLREFLIMIT) >= 0 && _statistics->stallRefinements >= intParam(STALLREFLIMIT));

   return stoppedTime || stoppedIter;
}